

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O2

void __thiscall SubprocessSet::Clear(SubprocessSet *this)

{
  Subprocess *this_00;
  pointer ppSVar1;
  pointer ppSVar2;
  
  for (ppSVar2 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar2 !=
      (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar2 = ppSVar2 + 1) {
    if ((*ppSVar2)->use_console_ == false) {
      kill(-(*ppSVar2)->pid_,interrupted_);
    }
  }
  for (ppSVar1 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar1 != ppSVar2; ppSVar1 = ppSVar1 + 1
      ) {
    this_00 = *ppSVar1;
    if (this_00 != (Subprocess *)0x0) {
      Subprocess::~Subprocess(this_00);
    }
    operator_delete(this_00,0x30);
    ppSVar2 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  ppSVar1 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (ppSVar2 != ppSVar1) {
    (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  return;
}

Assistant:

void SubprocessSet::Clear() {
  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i)
    // Since the foreground process is in our process group, it will receive
    // the interruption signal (i.e. SIGINT or SIGTERM) at the same time as us.
    if (!(*i)->use_console_)
      kill(-(*i)->pid_, interrupted_);
  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i)
    delete *i;
  running_.clear();
}